

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int http_sendfile(http_s *r,int fd,uintptr_t length,uintptr_t offset)

{
  FIOBJ key;
  int iVar1;
  FIOBJ FVar2;
  FIOBJ obj;
  
  if ((r != (http_s *)0x0) && (((r->method != 0 || (r->status_str != 0)) || (r->status == 0)))) {
    add_content_length(r,length);
    if (add_content_type_ct_hash == 0) {
      add_content_type_ct_hash = fiobj_hash_string("content-type",0xc);
    }
    FVar2 = fiobj_hash_get2((r->private_data).out_headers,add_content_type_ct_hash);
    key = HTTP_HEADER_CONTENT_TYPE;
    if (FVar2 == 0) {
      FVar2 = (r->private_data).out_headers;
      obj = http_mimetype_find2(r->path);
      fiobj_hash_set(FVar2,key,obj);
    }
    add_date(r);
    iVar1 = (**(code **)((long)(r->private_data).vtbl + 8))(r,fd,length,offset);
    return iVar1;
  }
  close(fd);
  return -1;
}

Assistant:

int http_sendfile(http_s *r, int fd, uintptr_t length, uintptr_t offset) {
  if (HTTP_INVALID_HANDLE(r)) {
    close(fd);
    return -1;
  };
  add_content_length(r, length);
  add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_sendfile(r, fd, length, offset);
}